

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Covariance4D.hpp
# Opt level: O0

void __thiscall
Covariance::Covariance4D<Vector,_double>::Projection(Covariance4D<Vector,_double> *this,Vector *n)

{
  Vector *in_RSI;
  Vector *in_RDI;
  double *w1;
  double dVar1;
  double __x;
  Covariance4D<Vector,_double> *unaff_retaddr;
  double cosine;
  double s;
  double c;
  double alpha;
  double cy;
  double cx;
  double local_c8;
  Vector *in_stack_ffffffffffffff48;
  Vector *in_stack_ffffffffffffff50;
  double in_stack_ffffffffffffff58;
  Covariance4D<Vector,_double> *in_stack_ffffffffffffff60;
  double local_98;
  double local_90;
  double local_58;
  double local_50;
  double local_48;
  Vector *c_00;
  
  c_00 = in_RDI;
  dVar1 = Vector::Dot((Vector *)&in_RDI[3].y,in_RSI);
  __x = Vector::Dot((Vector *)&in_RDI[4].y,in_RSI);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    local_c8 = atan2(dVar1,__x);
  }
  else {
    local_c8 = 0.0;
  }
  cos(local_c8);
  sin(local_c8);
  Rotate(unaff_retaddr,(double)c_00,(double)in_RSI);
  w1 = &in_RDI[5].y;
  dVar1 = Vector::Dot((Vector *)w1,in_RSI);
  std::abs((int)w1);
  ScaleY(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  operator*((double)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  operator*((double)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  operator+(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  in_RDI[3].y = local_58;
  in_RDI[3].z = local_50;
  in_RDI[4].x = local_48;
  if (0.0 <= dVar1) {
    in_stack_ffffffffffffff60 = (Covariance4D<Vector,_double> *)in_RSI->x;
    local_98 = in_RSI->y;
    local_90 = in_RSI->z;
  }
  else {
    operator-(in_RDI);
  }
  in_RDI[5].y = (double)in_stack_ffffffffffffff60;
  in_RDI[5].z = local_98;
  in_RDI[6].x = local_90;
  if (0.0 <= dVar1) {
    Vector::Cross(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    Vector::Cross(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  in_RDI[4].y = (double)in_stack_ffffffffffffff48;
  in_RDI[4].z = (double)in_stack_ffffffffffffff50;
  in_RDI[5].x = in_stack_ffffffffffffff58;
  return;
}

Assistant:

inline void Projection(const Vector& n) {

         const auto cx = Vector::Dot(x, n);
         const auto cy = Vector::Dot(y, n);

         // Rotate the Frame to be aligned with plane.
         const Float alpha = (cx != 0.0) ? atan2(cx, cy) : 0.0;
         const Float c = cos(alpha), s = -sin(alpha);
         Rotate(c, s);

         // Scale the componnent that project by the cosine of the ray direction
         // and the normal.
         const Float cosine = Vector::Dot(z, n);
         ScaleY(std::abs(cosine));

         // Update direction vectors.
         x = c*x + s*y;
         z = (cosine < 0.0f) ? -n : n;
         y = (cosine < 0.0f) ?  Vector::Cross(x, z) : Vector::Cross(z, x);
      }